

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O2

reverse_iterator * __thiscall
immutable::vector<int,_false,_6>::rend
          (reverse_iterator *__return_storage_ptr__,vector<int,_false,_6> *this)

{
  ref<immutable::rrb<int,_false,_6>_> local_28;
  undefined4 local_20;
  uint uStack_1c;
  undefined8 uStack_18;
  undefined8 local_10;
  
  local_28.ptr = (this->_impl).ptr;
  if (local_28.ptr != (rrb<int,_false,_6> *)0x0) {
    (local_28.ptr)->_ref_count = (local_28.ptr)->_ref_count + 1;
  }
  local_20 = 0;
  uStack_18 = 0xffffffffffffffff;
  local_10 = 0;
  (__return_storage_ptr__->current)._impl.ptr = local_28.ptr;
  if (local_28.ptr != (rrb<int,_false,_6> *)0x0) {
    (local_28.ptr)->_ref_count = (local_28.ptr)->_ref_count + 1;
  }
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Head_base<0UL,_const_int_*,_false>._M_head_impl = (int *)0x0;
  *(ulong *)&(__return_storage_ptr__->current)._index = (ulong)uStack_1c << 0x20;
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Tuple_impl<2UL,_unsigned_int> =
       (_Head_base<2UL,_unsigned_int,_false>)0xffffffff;
  (__return_storage_ptr__->current)._cursor.
  super__Tuple_impl<0UL,_const_int_*,_unsigned_int,_unsigned_int>.
  super__Tuple_impl<1UL,_unsigned_int,_unsigned_int>.super__Head_base<1UL,_unsigned_int,_false> =
       0xffffffff;
  ref<immutable::rrb<int,_false,_6>_>::~ref(&local_28);
  return __return_storage_ptr__;
}

Assistant:

reverse_iterator rend() const
        {
        return reverse_iterator{ begin() };
        }